

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkmanagerservice.cpp
# Opt level: O0

void __thiscall QNetworkManagerInterface::~QNetworkManagerInterface(QNetworkManagerInterface *this)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  char *in_RDI;
  long in_FS_OFFSET;
  size_t in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  char *str;
  QString *in_stack_ffffffffffffff10;
  QObject *this_00;
  QDBusConnection *this_01;
  QObject local_70 [24];
  undefined1 local_58 [24];
  undefined1 local_40 [24];
  undefined1 local_28 [24];
  QDBusConnection local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = local_10;
  QDBusConnection::systemBus();
  Qt::Literals::StringLiterals::operator____L1(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  latin1.m_data = in_RDI;
  latin1.m_size = (qsizetype)this_01;
  QString::QString(in_stack_ffffffffffffff10,latin1);
  str = (char *)0x1f;
  Qt::Literals::StringLiterals::operator____L1((char *)0x1f,in_stack_ffffffffffffff00);
  latin1_00.m_data = in_RDI;
  latin1_00.m_size = (qsizetype)this_01;
  QString::QString(in_stack_ffffffffffffff10,latin1_00);
  Qt::Literals::StringLiterals::operator____L1(str,in_stack_ffffffffffffff00);
  latin1_01.m_data = in_RDI;
  latin1_01.m_size = (qsizetype)this_01;
  QString::QString(in_stack_ffffffffffffff10,latin1_01);
  this_00 = local_70;
  latin1_02.m_data = in_RDI;
  latin1_02.m_size = (qsizetype)this_01;
  QString::QString((QString *)this_00,latin1_02);
  QDBusConnection::disconnect
            ((QString *)this_01,(QString *)local_28,(QString *)local_40,(QString *)local_58,this_00,
             in_RDI);
  QString::~QString((QString *)0x108952);
  QString::~QString((QString *)0x10895c);
  QString::~QString((QString *)0x108966);
  QString::~QString((QString *)0x108970);
  QDBusConnection::~QDBusConnection(this_01);
  QMap<QString,_QVariant>::~QMap((QMap<QString,_QVariant> *)0x108988);
  QNetworkManagerInterfaceBase::~QNetworkManagerInterfaceBase
            ((QNetworkManagerInterfaceBase *)0x108992);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkManagerInterface::~QNetworkManagerInterface()
{
    QDBusConnection::systemBus().disconnect(NM_DBUS_SERVICE, NM_DBUS_PATH,
            DBUS_PROPERTIES_INTERFACE, propertiesChangedKey, this,
            SLOT(setProperties(QString,QMap<QString,QVariant>,QList<QString>)));
}